

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

string * helics::brokerStateName_abi_cxx11_(BrokerState state)

{
  int iVar1;
  undefined2 in_DI;
  allocator<char> *in_stack_ffffffffffffffa0;
  allocator<char> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25;
  allocator<char> local_24;
  allocator<char> local_23;
  allocator<char> local_22;
  allocator<char> local_21;
  undefined1 local_20 [2];
  allocator<char> local_1e;
  allocator<char> local_1d [18];
  allocator<char> local_b [3];
  string *local_8;
  
  local_b._1_2_ = in_DI;
  if ((brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::createdString_abi_cxx11_ == '\0'
      ) && (iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)
                                         ::createdString_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
              );
    std::allocator<char>::~allocator(local_b);
    __cxa_atexit(std::__cxx11::string::~string,
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  createdString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                         createdString_abi_cxx11_);
  }
  if ((brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::configuringString_abi_cxx11_ ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                   configuringString_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
              );
    std::allocator<char>::~allocator(local_1d);
    __cxa_atexit(std::__cxx11::string::~string,
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  configuringString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                         configuringString_abi_cxx11_);
  }
  if ((brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::configuredString_abi_cxx11_ ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                   configuredString_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
              );
    std::allocator<char>::~allocator(&local_1e);
    __cxa_atexit(std::__cxx11::string::~string,
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  configuredString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                         configuredString_abi_cxx11_);
  }
  if ((brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::connectingString_abi_cxx11_ ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                   connectingString_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
              );
    std::allocator<char>::~allocator((allocator<char> *)(local_20 + 1));
    __cxa_atexit(std::__cxx11::string::~string,
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  connectingString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                         connectingString_abi_cxx11_);
  }
  if ((brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::connectedString_abi_cxx11_ ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                   connectedString_abi_cxx11_), iVar1 != 0)) {
    in_stack_ffffffffffffffb0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
              );
    std::allocator<char>::~allocator((allocator<char> *)local_20);
    __cxa_atexit(std::__cxx11::string::~string,
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  connectedString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                         connectedString_abi_cxx11_);
  }
  if ((brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::initializingString_abi_cxx11_ ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                   initializingString_abi_cxx11_), iVar1 != 0)) {
    in_stack_ffffffffffffffa8 = &local_21;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
              );
    std::allocator<char>::~allocator(&local_21);
    __cxa_atexit(std::__cxx11::string::~string,
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  initializingString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                         initializingString_abi_cxx11_);
  }
  if ((brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::operatingString_abi_cxx11_ ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                   operatingString_abi_cxx11_), iVar1 != 0)) {
    in_stack_ffffffffffffffa0 = &local_22;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
              );
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    __cxa_atexit(std::__cxx11::string::~string,
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  operatingString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                         operatingString_abi_cxx11_);
  }
  if ((brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::terminatingString_abi_cxx11_ ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                   terminatingString_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
              );
    std::allocator<char>::~allocator(&local_23);
    __cxa_atexit(std::__cxx11::string::~string,
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  terminatingString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                         terminatingString_abi_cxx11_);
  }
  if ((brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
       terminatingErrorString_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                   terminatingErrorString_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
              );
    std::allocator<char>::~allocator(&local_24);
    __cxa_atexit(std::__cxx11::string::~string,
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  terminatingErrorString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                         terminatingErrorString_abi_cxx11_);
  }
  if ((brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::terminatedString_abi_cxx11_ ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                   terminatedString_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
              );
    std::allocator<char>::~allocator(&local_25);
    __cxa_atexit(std::__cxx11::string::~string,
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  terminatedString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                         terminatedString_abi_cxx11_);
  }
  if ((brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::erroredString_abi_cxx11_ == '\0'
      ) && (iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)
                                         ::erroredString_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
              );
    std::allocator<char>::~allocator(&local_26);
    __cxa_atexit(std::__cxx11::string::~string,
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  erroredString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                         erroredString_abi_cxx11_);
  }
  if ((brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::connectedErrorString_abi_cxx11_
       == '\0') &&
     (iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                   connectedErrorString_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
              );
    std::allocator<char>::~allocator(&local_27);
    __cxa_atexit(std::__cxx11::string::~string,
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  connectedErrorString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                         connectedErrorString_abi_cxx11_);
  }
  if ((brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::otherString_abi_cxx11_ == '\0')
     && (iVar1 = __cxa_guard_acquire(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                                      otherString_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
              );
    std::allocator<char>::~allocator(&local_28);
    __cxa_atexit(std::__cxx11::string::~string,
                 &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                  otherString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
                         otherString_abi_cxx11_);
  }
  switch(local_b._1_2_) {
  case 0:
    local_8 = &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
               operatingString_abi_cxx11_;
    break;
  case 3:
    local_8 = &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
               connectedErrorString_abi_cxx11_;
    break;
  case 4:
    local_8 = &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
               terminatingString_abi_cxx11_;
    break;
  case 5:
    local_8 = &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
               terminatingErrorString_abi_cxx11_;
    break;
  case 6:
    local_8 = &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
               terminatedString_abi_cxx11_;
    break;
  case 7:
    local_8 = &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::erroredString_abi_cxx11_
    ;
    break;
  case 0xfff6:
    local_8 = &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::createdString_abi_cxx11_
    ;
    break;
  default:
    local_8 = &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::otherString_abi_cxx11_;
    break;
  case 0xfff9:
    local_8 = &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
               configuringString_abi_cxx11_;
    break;
  case 0xfffa:
    local_8 = &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
               configuredString_abi_cxx11_;
    break;
  case 0xfffc:
    local_8 = &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
               connectingString_abi_cxx11_;
    break;
  case 0xfffd:
    local_8 = &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
               connectedString_abi_cxx11_;
    break;
  case 0xffff:
    local_8 = &brokerStateName[abi:cxx11](helics::BrokerBase::BrokerState)::
               initializingString_abi_cxx11_;
  }
  return local_8;
}

Assistant:

const std::string& brokerStateName(BrokerBase::BrokerState state)
{
    static const std::string createdString = "created";
    static const std::string configuringString = "configuring";
    static const std::string configuredString = "configured";
    static const std::string connectingString = "connecting";
    static const std::string connectedString = "connected";
    static const std::string initializingString = "initializing";
    static const std::string operatingString = "operating";
    static const std::string terminatingString = "terminating";
    static const std::string terminatingErrorString = "terminating_error";
    static const std::string terminatedString = "terminated";
    static const std::string erroredString = "error";
    static const std::string connectedErrorString = "connected_error";
    static const std::string otherString = "other";
    switch (state) {
        case BrokerBase::BrokerState::CREATED:
            return createdString;
        case BrokerBase::BrokerState::CONFIGURING:
            return configuringString;
        case BrokerBase::BrokerState::CONFIGURED:
            return configuredString;
        case BrokerBase::BrokerState::CONNECTING:
            return connectingString;
        case BrokerBase::BrokerState::CONNECTED:
            return connectedString;
        case BrokerBase::BrokerState::INITIALIZING:
            return initializingString;
        case BrokerBase::BrokerState::OPERATING:
            return operatingString;
        case BrokerBase::BrokerState::TERMINATING:
            return terminatingString;
        case BrokerBase::BrokerState::TERMINATING_ERROR:
            return terminatingErrorString;
        case BrokerBase::BrokerState::TERMINATED:
            return terminatedString;
        case BrokerBase::BrokerState::ERRORED:
            return erroredString;
        case BrokerBase::BrokerState::CONNECTED_ERROR:
            return connectedErrorString;
        default:
            return otherString;
    }
}